

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::adjust_lines
          (geofile *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes)

{
  int iVar1;
  bool bVar2;
  key_type *pkVar3;
  pointer ppVar4;
  reference piVar5;
  pointer ppVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  iterator j;
  iterator vec_end;
  iterator i_1;
  iterator c_l_m_it;
  iterator c_l_m_end;
  insert_return_type local_68;
  undefined1 local_40 [8];
  node_type nodeHandler;
  iterator i;
  iterator change_end;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes_local;
  geofile *this_local;
  
  i = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(changes);
  nodeHandler._M_pmapped =
       (__pointer<typename_pair<const_int,_line>::second_type>)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (changes);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&nodeHandler._M_pmapped,&i);
    if (!bVar2) break;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped);
    std::map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
    extract((node_type *)local_40,&this->lines_map,&ppVar6->first);
    bVar2 = std::
            _Node_handle_common<std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
            ::empty((_Node_handle_common<std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
                     *)local_40);
    if (!bVar2) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped);
      iVar1 = ppVar6->second;
      pkVar3 = std::
               _Node_handle<int,_std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
               ::key((_Node_handle<int,_std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
                      *)local_40);
      *pkVar3 = iVar1;
      std::map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
      insert(&local_68,&this->lines_map,
             (_Node_handle<int,_std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
              *)local_40);
      std::
      _Node_insert_return<std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>,_std::_Node_handle<int,_std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>_>
      ::~_Node_insert_return(&local_68);
    }
    std::
    _Node_handle<int,_std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
    ::~_Node_handle((_Node_handle<int,_std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
                     *)local_40);
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped,0);
  }
  c_l_m_it = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::end(&this->curve_loops_map);
  i_1._M_node = (_Base_ptr)
                std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::begin(&this->curve_loops_map);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&i_1,&c_l_m_it);
    if (!bVar2) break;
    vec_end._M_current =
         (int *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                begin(changes);
    while( true ) {
      bVar2 = std::operator!=((_Self *)&vec_end,&i);
      if (!bVar2) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)&i_1);
      j = std::vector<int,_std::allocator<int>_>::end(&ppVar4->second);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)&i_1);
      local_a8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar4->second);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&local_a8,&j);
        if (!bVar2) break;
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_a8);
        iVar1 = *piVar5;
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vec_end);
        if (iVar1 == ppVar6->first) {
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vec_end);
          iVar1 = ppVar6->second;
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_a8);
          *piVar5 = iVar1;
        }
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_a8);
        iVar1 = *piVar5;
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vec_end);
        if (iVar1 == -ppVar6->first) {
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vec_end);
          iVar1 = ppVar6->second;
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_a8);
          *piVar5 = -iVar1;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_a8,0);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vec_end,0);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               &i_1,0);
  }
  return 0;
}

Assistant:

int GEO::geofile::adjust_lines(std::map<int,int> changes)
{
    auto change_end = changes.end();
    for (auto i = changes.begin(); i != change_end; i++)
    {
        auto nodeHandler = lines_map.extract(i->first);
        if(!nodeHandler.empty())
        {
            nodeHandler.key() = i->second;
            lines_map.insert(std::move(nodeHandler));
        }
    }
    // Adjust dependencies to mirror the changes.
    // Curve loops
    auto c_l_m_end  = curve_loops_map.end();
    for (auto c_l_m_it = curve_loops_map.begin(); c_l_m_it != c_l_m_end; c_l_m_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            auto vec_end = c_l_m_it->second.end();
            for (auto j = c_l_m_it->second.begin(); j != vec_end; j++)
            {
                if(*j==i->first)
                    *j=i->second;
                if(*j==-i->first)
                    *j=-i->second;
            }
        }
    }
    return EXIT_SUCCESS;
}